

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkDefaultCompatibility
          (CompatibilityChecker *this,Reader *value,Reader *replacement)

{
  bool bVar1;
  Which WVar2;
  Fault local_330;
  Fault f_13;
  undefined1 local_320 [8];
  DebugComparison<unsigned_short,_unsigned_short> _kjCondition_13;
  Fault f_12;
  double local_2f0;
  DebugExpression<double> local_2e8;
  undefined1 local_2e0 [8];
  DebugComparison<double,_double> _kjCondition_12;
  Fault f_11;
  float local_2a8;
  DebugExpression<float> local_2a4;
  undefined1 local_2a0 [8];
  DebugComparison<float,_float> _kjCondition_11;
  Fault f_10;
  uint64_t local_270;
  DebugExpression<unsigned_long> local_268;
  undefined1 local_260 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_10;
  Fault f_9;
  uint32_t local_228;
  DebugExpression<unsigned_int> local_224;
  undefined1 local_220 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_9;
  Fault f_8;
  undefined1 local_1f0 [8];
  DebugComparison<unsigned_short,_unsigned_short> _kjCondition_8;
  Fault f_7;
  undefined1 local_1c0 [8];
  DebugComparison<unsigned_char,_unsigned_char> _kjCondition_7;
  Fault f_6;
  int64_t local_190;
  DebugExpression<long> local_188;
  undefined1 local_180 [8];
  DebugComparison<long,_long> _kjCondition_6;
  Fault f_5;
  int32_t local_148;
  DebugExpression<int> local_144;
  undefined1 local_140 [8];
  DebugComparison<int,_int> _kjCondition_5;
  Fault f_4;
  undefined1 local_110 [8];
  DebugComparison<short,_short> _kjCondition_4;
  Fault f_3;
  undefined1 local_e0 [8];
  DebugComparison<signed_char,_signed_char> _kjCondition_3;
  Fault f_2;
  undefined1 local_b0 [8];
  DebugComparison<bool,_bool> _kjCondition_2;
  Fault f_1;
  undefined1 local_80 [8];
  DebugComparison<capnp::Void,_capnp::Void> _kjCondition_1;
  Fault local_50;
  Fault f;
  undefined1 local_40 [8];
  DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which> _kjCondition;
  Reader *replacement_local;
  Reader *value_local;
  CompatibilityChecker *this_local;
  
  _kjCondition._24_8_ = replacement;
  f.exception._4_2_ = capnp::schema::Value::Reader::which(value);
  f.exception._6_2_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Which *)((long)&f.exception + 4));
  f.exception._2_2_ = capnp::schema::Value::Reader::which((Reader *)_kjCondition._24_8_);
  kj::_::DebugExpression<capnp::schema::Value::Which>::operator==
            ((DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which> *)local_40,
             (DebugExpression<capnp::schema::Value::Which> *)((long)&f.exception + 6),
             (Which *)((long)&f.exception + 2));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (bVar1) {
    WVar2 = capnp::schema::Value::Reader::which(value);
    switch(WVar2) {
    case VOID:
      capnp::schema::Value::Reader::getVoid(value);
      kj::_::DebugExpressionStart::operator<<
                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)((long)&f_1.exception + 6));
      capnp::schema::Value::Reader::getVoid((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<capnp::Void>::operator==
                ((DebugComparison<capnp::Void,_capnp::Void> *)local_80,
                 (DebugExpression<capnp::Void> *)((long)&f_1.exception + 7),
                 (Void *)((long)&f_1.exception + 3));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::Void,capnp::Void>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_2.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b1,FAILED,"value.getVoid() == replacement.getVoid()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<capnp::Void,_capnp::Void> *)local_80,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_2.result);
      }
      break;
    case BOOL:
      f_2.exception._6_1_ = capnp::schema::Value::Reader::getBool(value);
      f_2.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (bool *)((long)&f_2.exception + 6));
      f_2.exception._5_1_ = capnp::schema::Value::Reader::getBool((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<bool>::operator==
                ((DebugComparison<bool,_bool> *)local_b0,
                 (DebugExpression<bool> *)((long)&f_2.exception + 7),
                 (bool *)((long)&f_2.exception + 5));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<bool,bool>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_3.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b2,FAILED,"value.getBool() == replacement.getBool()",
                   "_kjCondition,\"default value changed\"",(DebugComparison<bool,_bool> *)local_b0,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3.result);
      }
      break;
    case INT8:
      f_3.exception._6_1_ = capnp::schema::Value::Reader::getInt8(value);
      f_3.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (char *)((long)&f_3.exception + 6));
      f_3.exception._5_1_ = capnp::schema::Value::Reader::getInt8((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<signed_char>::operator==
                ((DebugComparison<signed_char,_signed_char> *)local_e0,
                 (DebugExpression<signed_char> *)((long)&f_3.exception + 7),
                 (char *)((long)&f_3.exception + 5));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<signed_char,signed_char>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_4.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b3,FAILED,"value.getInt8() == replacement.getInt8()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<signed_char,_signed_char> *)local_e0,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_4.result);
      }
      break;
    case INT16:
      f_4.exception._4_2_ = capnp::schema::Value::Reader::getInt16(value);
      f_4.exception._6_2_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (short *)((long)&f_4.exception + 4));
      f_4.exception._2_2_ = capnp::schema::Value::Reader::getInt16((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<short>::operator==
                ((DebugComparison<short,_short> *)local_110,
                 (DebugExpression<short> *)((long)&f_4.exception + 6),
                 (short *)((long)&f_4.exception + 2));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_110);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<short,short>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_5.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b4,FAILED,"value.getInt16() == replacement.getInt16()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<short,_short> *)local_110,(char (*) [22])"default value changed"
                  );
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_5.result);
      }
      break;
    case INT32:
      local_148 = capnp::schema::Value::Reader::getInt32(value);
      local_144 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_148);
      f_5.exception._4_4_ = capnp::schema::Value::Reader::getInt32((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<int>::operator==
                ((DebugComparison<int,_int> *)local_140,&local_144,(int *)((long)&f_5.exception + 4)
                );
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_6.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b5,FAILED,"value.getInt32() == replacement.getInt32()",
                   "_kjCondition,\"default value changed\"",(DebugComparison<int,_int> *)local_140,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_6.result);
      }
      break;
    case INT64:
      local_190 = capnp::schema::Value::Reader::getInt64(value);
      local_188 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_190);
      f_6.exception =
           (Exception *)capnp::schema::Value::Reader::getInt64((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<long>::operator==
                ((DebugComparison<long,_long> *)local_180,&local_188,(long *)&f_6);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long,long>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_7.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b6,FAILED,"value.getInt64() == replacement.getInt64()",
                   "_kjCondition,\"default value changed\"",(DebugComparison<long,_long> *)local_180
                   ,(char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_7.result);
      }
      break;
    case UINT8:
      f_7.exception._6_1_ = capnp::schema::Value::Reader::getUint8(value);
      f_7.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (uchar *)((long)&f_7.exception + 6));
      f_7.exception._5_1_ = capnp::schema::Value::Reader::getUint8((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<unsigned_char>::operator==
                ((DebugComparison<unsigned_char,_unsigned_char> *)local_1c0,
                 (DebugExpression<unsigned_char> *)((long)&f_7.exception + 7),
                 (uchar *)((long)&f_7.exception + 5));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char,unsigned_char>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_8.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b7,FAILED,"value.getUint8() == replacement.getUint8()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<unsigned_char,_unsigned_char> *)local_1c0,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_8.result);
      }
      break;
    case UINT16:
      f_8.exception._4_2_ = capnp::schema::Value::Reader::getUint16(value);
      f_8.exception._6_2_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (unsigned_short *)((long)&f_8.exception + 4));
      f_8.exception._2_2_ = capnp::schema::Value::Reader::getUint16((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<unsigned_short>::operator==
                ((DebugComparison<unsigned_short,_unsigned_short> *)local_1f0,
                 (DebugExpression<unsigned_short> *)((long)&f_8.exception + 6),
                 (unsigned_short *)((long)&f_8.exception + 2));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_short>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_9.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b8,FAILED,"value.getUint16() == replacement.getUint16()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<unsigned_short,_unsigned_short> *)local_1f0,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_9.result);
      }
      break;
    case UINT32:
      local_228 = capnp::schema::Value::Reader::getUint32(value);
      local_224 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_228);
      f_9.exception._4_4_ = capnp::schema::Value::Reader::getUint32((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<unsigned_int>::operator==
                ((DebugComparison<unsigned_int,_unsigned_int> *)local_220,&local_224,
                 (uint *)((long)&f_9.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_220);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_10.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4b9,FAILED,"value.getUint32() == replacement.getUint32()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_220,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_10.result);
      }
      break;
    case UINT64:
      local_270 = capnp::schema::Value::Reader::getUint64(value);
      local_268 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_270);
      f_10.exception =
           (Exception *)capnp::schema::Value::Reader::getUint64((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<unsigned_long>::operator==
                ((DebugComparison<unsigned_long,_unsigned_long> *)local_260,&local_268,
                 (unsigned_long *)&f_10);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_260);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_11.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4ba,FAILED,"value.getUint64() == replacement.getUint64()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<unsigned_long,_unsigned_long> *)local_260,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_11.result);
      }
      break;
    case FLOAT32:
      local_2a8 = capnp::schema::Value::Reader::getFloat32(value);
      local_2a4 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2a8);
      f_11.exception._4_4_ = capnp::schema::Value::Reader::getFloat32((Reader *)_kjCondition._24_8_)
      ;
      kj::_::DebugExpression<float>::operator==
                ((DebugComparison<float,_float> *)local_2a0,&local_2a4,
                 (float *)((long)&f_11.exception + 4));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<float,float>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_12.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4bb,FAILED,"value.getFloat32() == replacement.getFloat32()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<float,_float> *)local_2a0,(char (*) [22])"default value changed"
                  );
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_12.result);
      }
      break;
    case FLOAT64:
      local_2f0 = capnp::schema::Value::Reader::getFloat64(value);
      local_2e8 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2f0);
      f_12.exception =
           (Exception *)capnp::schema::Value::Reader::getFloat64((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<double>::operator==
                ((DebugComparison<double,_double> *)local_2e0,&local_2e8,(double *)&f_12);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2e0);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<double,double>&,char_const(&)[22]>
                  ((Fault *)&_kjCondition_13.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4bc,FAILED,"value.getFloat64() == replacement.getFloat64()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<double,_double> *)local_2e0,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_13.result);
      }
      break;
    case TEXT:
    case DATA:
    case LIST:
    case STRUCT:
    case INTERFACE:
    case ANY_POINTER:
      break;
    case ENUM:
      f_13.exception._4_2_ = capnp::schema::Value::Reader::getEnum(value);
      f_13.exception._6_2_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (unsigned_short *)((long)&f_13.exception + 4));
      f_13.exception._2_2_ = capnp::schema::Value::Reader::getEnum((Reader *)_kjCondition._24_8_);
      kj::_::DebugExpression<unsigned_short>::operator==
                ((DebugComparison<unsigned_short,_unsigned_short> *)local_320,
                 (DebugExpression<unsigned_short> *)((long)&f_13.exception + 6),
                 (unsigned_short *)((long)&f_13.exception + 2));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_320);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_short>&,char_const(&)[22]>
                  (&local_330,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x4bd,FAILED,"value.getEnum() == replacement.getEnum()",
                   "_kjCondition,\"default value changed\"",
                   (DebugComparison<unsigned_short,_unsigned_short> *)local_320,
                   (char (*) [22])"default value changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&local_330);
      }
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Value::Which,capnp::schema::Value::Which>&>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4a7,FAILED,"value.which() == replacement.which()","_kjCondition,",
               (DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which> *)local_40
              );
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&local_50);
  }
  return;
}

Assistant:

void checkDefaultCompatibility(const schema::Value::Reader& value,
                                 const schema::Value::Reader& replacement) {
    // Note that we test default compatibility only after testing type compatibility, and default
    // values have already been validated as matching their types, so this should pass.
    KJ_ASSERT(value.which() == replacement.which()) {
      compatibility = INCOMPATIBLE;
      return;
    }

    switch (value.which()) {
#define HANDLE_TYPE(discrim, name) \
      case schema::Value::discrim: \
        VALIDATE_SCHEMA(value.get##name() == replacement.get##name(), "default value changed"); \
        break;
      HANDLE_TYPE(VOID, Void);
      HANDLE_TYPE(BOOL, Bool);
      HANDLE_TYPE(INT8, Int8);
      HANDLE_TYPE(INT16, Int16);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT8, Uint8);
      HANDLE_TYPE(UINT16, Uint16);
      HANDLE_TYPE(UINT32, Uint32);
      HANDLE_TYPE(UINT64, Uint64);
      HANDLE_TYPE(FLOAT32, Float32);
      HANDLE_TYPE(FLOAT64, Float64);
      HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

      case schema::Value::TEXT:
      case schema::Value::DATA:
      case schema::Value::LIST:
      case schema::Value::STRUCT:
      case schema::Value::INTERFACE:
      case schema::Value::ANY_POINTER:
        // It's not a big deal if default values for pointers change, and it would be difficult for
        // us to compare these defaults here, so just let it slide.
        break;
    }
  }